

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

void __thiscall
GF2::BFunc<6ul>::To<GF2::MOLex<6ul>>(BFunc<6ul> *this,MP<6UL,_GF2::MOLex<6UL>_> *polyRight)

{
  bool bVar1;
  byte bVar2;
  MM<6UL> x;
  MM<6UL> mon;
  WW<6UL> local_38;
  WW<6UL> local_30;
  
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
            (&polyRight->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>);
  local_30._words[0] = (word  [1])0;
  do {
    local_38._words[0] = (word  [1])0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 ^ (~(ulong)local_38._words[0] | (ulong)local_30._words[0]) == 0xffffffffffffffff
                      & (byte)this[(long)local_38._words[0]];
      bVar1 = WW<6UL>::Next(&local_38,false);
    } while (bVar1);
    if (bVar2 != 0) {
      MP<6UL,_GF2::MOLex<6UL>_>::SymDiff(polyRight,(MM<6UL> *)&local_30);
    }
    bVar1 = WW<6UL>::Next(&local_30,false);
  } while (bVar1);
  return;
}

Assistant:

void To(MP<_n, _O>& polyRight) const
	{	
		polyRight = 0;
		// цикл по мономам
		MM<_n> mon;
		do
		{
			bool bCoeff = 0;
			MM<_n> x;
			do bCoeff ^= x.Calc(mon) & Get(x);
			while (x.Next());
			if (bCoeff)
				polyRight += mon;
		}
		while(mon.Next());
	}